

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transformparser.cpp
# Opt level: O3

mat4f * parseTransform(mat4f *__return_storage_ptr__,Json *conf)

{
  json_value jVar1;
  value_t vVar2;
  bool bVar3;
  int i;
  const_reference pvVar4;
  long lVar5;
  undefined8 *puVar6;
  float *pfVar7;
  long lVar8;
  long lVar9;
  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  *other;
  float fVar10;
  float fVar11;
  vec3f vVar12;
  vector<float,_std::allocator<float>_> v;
  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_f8;
  undefined8 local_d8;
  float local_d0;
  undefined8 local_cc;
  undefined8 uStack_c4;
  undefined4 local_bc;
  iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
  local_b8;
  undefined8 local_98;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined8 uStack_80;
  float local_78;
  float fStack_74;
  float fStack_70;
  float fStack_6c;
  float local_68;
  float fStack_64;
  float local_58;
  float local_48;
  float local_38;
  
  vVar2 = conf->m_type;
  if (vVar2 == array) {
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
    ::get<std::vector<float,_std::allocator<float>_>,_std::vector<float,_std::allocator<float>_>,_0>
              ((vector<float,_std::allocator<float>_> *)&local_b8,conf);
    if ((long)local_b8.m_it.object_iterator._M_node - (long)local_b8.m_object == 0x40) {
      jVar1 = (local_b8.m_object)->m_value;
      *(undefined8 *)__return_storage_ptr__->data[0] = *(undefined8 *)local_b8.m_object;
      *(json_value *)(__return_storage_ptr__->data[0] + 2) = jVar1;
      jVar1 = local_b8.m_object[1].m_value;
      *(undefined8 *)__return_storage_ptr__->data[1] = *(undefined8 *)(local_b8.m_object + 1);
      *(json_value *)(__return_storage_ptr__->data[1] + 2) = jVar1;
      jVar1 = local_b8.m_object[2].m_value;
      *(undefined8 *)__return_storage_ptr__->data[2] = *(undefined8 *)(local_b8.m_object + 2);
      *(json_value *)(__return_storage_ptr__->data[2] + 2) = jVar1;
      jVar1 = local_b8.m_object[3].m_value;
      *(undefined8 *)__return_storage_ptr__->data[3] = *(undefined8 *)(local_b8.m_object + 3);
      *(json_value *)(__return_storage_ptr__->data[3] + 2) = jVar1;
      operator_delete(local_b8.m_object,
                      (long)local_b8.m_it.array_iterator._M_current - (long)local_b8.m_object);
      return __return_storage_ptr__;
    }
    puVar6 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar6 = "bad transformation matrix";
    __cxa_throw(puVar6,&char_const*::typeinfo,0);
  }
  *(float *)((long)(__return_storage_ptr__->data + 3) + 0) = 0.0;
  *(float *)((long)(__return_storage_ptr__->data + 3) + 4) = 0.0;
  *(float *)((long)(__return_storage_ptr__->data + 3) + 8) = 0.0;
  *(float *)((long)(__return_storage_ptr__->data + 3) + 0xc) = 1.0;
  *(float *)((long)(__return_storage_ptr__->data + 2) + 0) = 0.0;
  *(float *)((long)(__return_storage_ptr__->data + 2) + 4) = 0.0;
  *(float *)((long)(__return_storage_ptr__->data + 2) + 8) = 1.0;
  *(float *)((long)(__return_storage_ptr__->data + 2) + 0xc) = 0.0;
  *(float *)((long)(__return_storage_ptr__->data + 1) + 0) = 0.0;
  *(float *)((long)(__return_storage_ptr__->data + 1) + 4) = 1.0;
  *(float *)((long)(__return_storage_ptr__->data + 1) + 8) = 0.0;
  *(float *)((long)(__return_storage_ptr__->data + 1) + 0xc) = 0.0;
  *(float *)((long)(__return_storage_ptr__->data + 0) + 0) = 1.0;
  *(float *)((long)(__return_storage_ptr__->data + 0) + 4) = 0.0;
  *(float *)((long)(__return_storage_ptr__->data + 0) + 8) = 0.0;
  *(float *)((long)(__return_storage_ptr__->data + 0) + 0xc) = 0.0;
  local_b8.m_it.object_iterator._M_node = (_Base_ptr)0x0;
  local_b8.m_it.array_iterator._M_current =
       (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
        *)0x0;
  local_b8.m_it.primitive_iterator.m_it = -0x8000000000000000;
  local_b8.m_object = conf;
  if (vVar2 == object) {
    local_b8.m_it.object_iterator._M_node =
         (_Base_ptr)
         std::
         _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>>
         ::_M_find_tr<char[6],void>
                   ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>>
                     *)(conf->m_value).object,(char (*) [6])"scale");
    vVar2 = conf->m_type;
  }
  else {
    local_b8.m_it.primitive_iterator.m_it = 1;
  }
  local_f8.m_it.object_iterator._M_node = (_Base_ptr)0x0;
  local_f8.m_it.array_iterator._M_current = (pointer)0x0;
  local_f8.m_it.primitive_iterator.m_it = -0x8000000000000000;
  if (vVar2 == array) {
    local_f8.m_it.array_iterator._M_current =
         (((conf->m_value).array)->
         super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
  }
  else if (vVar2 == object) {
    local_f8.m_it.object_iterator._M_node =
         &(((conf->m_value).object)->_M_t)._M_impl.super__Rb_tree_header._M_header;
  }
  else {
    local_f8.m_it.primitive_iterator.m_it = 1;
  }
  local_f8.m_object = conf;
  bVar3 = nlohmann::detail::
          iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::operator==(&local_b8,&local_f8);
  if (!bVar3) {
    pvVar4 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)conf,"scale");
    vVar12 = json2vec3f(pvVar4);
    __return_storage_ptr__->data[0][0] = vVar12.x;
    __return_storage_ptr__->data[1][1] = vVar12.y;
    __return_storage_ptr__->data[2][2] = vVar12.z;
  }
  local_b8.m_it.object_iterator._M_node = (_Base_ptr)0x0;
  local_b8.m_it.array_iterator._M_current = (pointer)0x0;
  local_b8.m_it.primitive_iterator.m_it = -0x8000000000000000;
  vVar2 = conf->m_type;
  if (vVar2 == object) {
    local_b8.m_object = conf;
    local_b8.m_it.object_iterator._M_node =
         (_Base_ptr)
         std::
         _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>>
         ::_M_find_tr<char[9],void>
                   ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>>
                     *)(conf->m_value).object,(char (*) [9])"rotation");
    vVar2 = conf->m_type;
LAB_0013843c:
    local_f8.m_it.object_iterator._M_node = (_Base_ptr)0x0;
    local_f8.m_it.array_iterator._M_current = (pointer)0x0;
    local_f8.m_it.primitive_iterator.m_it = 0x8000000000000000;
    if (vVar2 == array) goto LAB_00138469;
    if (vVar2 == object) {
      local_f8.m_it.object_iterator._M_node =
           &(((conf->m_value).object)->_M_t)._M_impl.super__Rb_tree_header._M_header;
    }
    else {
      local_f8.m_it.primitive_iterator.m_it = 1;
    }
  }
  else {
    if (vVar2 != array) {
      local_b8.m_it.primitive_iterator.m_it = 1;
      local_b8.m_object = conf;
      goto LAB_0013843c;
    }
    local_b8.m_it.array_iterator._M_current =
         (((conf->m_value).array)->
         super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    local_b8.m_object = conf;
LAB_00138469:
    local_f8.m_it.primitive_iterator.m_it = 0x8000000000000000;
    local_f8.m_it.object_iterator._M_node = (_Base_ptr)0x0;
    local_f8.m_it.array_iterator._M_current =
         (((conf->m_value).array)->
         super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
  }
  other = &local_f8;
  local_f8.m_object = conf;
  bVar3 = nlohmann::detail::
          iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::operator==(&local_b8,other);
  if (!bVar3) {
    pvVar4 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)conf,"rotation");
    vVar12 = json2vec3f(pvVar4);
    fStack_74 = vVar12.y;
    local_68 = (vVar12.x * 3.1415927) / 180.0;
    local_78 = (fStack_74 * 3.1415927) / 180.0;
    fVar11 = (vVar12.z * 3.1415927) / 180.0;
    fStack_70 = fStack_74;
    fStack_6c = fStack_74;
    fStack_64 = fStack_74;
    local_48 = cosf(local_68);
    local_58 = cosf(local_78);
    local_38 = cosf(fVar11);
    local_68 = sinf(local_68);
    local_78 = sinf(local_78);
    fVar11 = sinf(fVar11);
    fVar10 = -local_78;
    local_f8.m_object =
         (Json *)CONCAT44(-local_58 * fVar11 + local_68 * fVar10 * local_38,
                          local_58 * local_38 + local_68 * fVar10 * fVar11);
    lVar5 = 0;
    local_f8.m_it.object_iterator._M_node._4_4_ = 0;
    local_f8.m_it.object_iterator._M_node._0_4_ = local_48 * fVar10;
    local_f8.m_it.array_iterator._M_current =
         (pointer)CONCAT44(local_48 * local_38,local_48 * fVar11);
    local_f8.m_it.primitive_iterator.m_it._4_4_ = 0;
    local_f8.m_it.primitive_iterator.m_it._0_4_ = -local_68;
    local_d8 = CONCAT44(fVar10 * fVar11 + local_68 * local_58 * local_38,
                        local_78 * local_38 + local_68 * local_58 * fVar11);
    local_d0 = local_48 * local_58;
    local_cc = 0;
    uStack_c4 = 0;
    local_bc = 0x3f800000;
    local_b8.m_object = (pointer)0x0;
    local_b8.m_it.object_iterator._M_node = (_Base_ptr)0x0;
    local_b8.m_it.array_iterator._M_current =
         (basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
          *)0x0;
    local_b8.m_it.primitive_iterator.m_it = 0;
    local_98 = 0;
    uStack_90 = 0;
    local_88 = 0;
    uStack_80 = 0;
    do {
      lVar8 = 0;
      pfVar7 = (float *)__return_storage_ptr__;
      do {
        fVar11 = *(float *)((long)&local_b8.m_object + lVar8 * 4 + lVar5 * 0x10);
        lVar9 = 0;
        do {
          fVar11 = fVar11 + *(float *)((long)&other->m_object + lVar9) * pfVar7[lVar9];
          lVar9 = lVar9 + 4;
        } while (lVar9 != 0x10);
        *(float *)((long)&local_b8.m_object + lVar8 * 4 + lVar5 * 0x10) = fVar11;
        lVar8 = lVar8 + 1;
        pfVar7 = pfVar7 + 1;
      } while (lVar8 != 4);
      lVar5 = lVar5 + 1;
      other = (iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
               *)&(other->m_it).array_iterator;
    } while (lVar5 != 4);
    *(undefined8 *)__return_storage_ptr__->data[3] = local_88;
    *(undefined8 *)(__return_storage_ptr__->data[3] + 2) = uStack_80;
    *(undefined8 *)__return_storage_ptr__->data[2] = local_98;
    *(undefined8 *)(__return_storage_ptr__->data[2] + 2) = uStack_90;
    *(basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>
      **)__return_storage_ptr__->data[1] = local_b8.m_it.array_iterator._M_current;
    *(difference_type *)(__return_storage_ptr__->data[1] + 2) =
         local_b8.m_it.primitive_iterator.m_it;
    *(pointer *)__return_storage_ptr__->data[0] = local_b8.m_object;
    *(_Base_ptr *)(__return_storage_ptr__->data[0] + 2) = local_b8.m_it.object_iterator._M_node;
  }
  local_b8.m_it.object_iterator._M_node = (_Base_ptr)0x0;
  local_b8.m_it.array_iterator._M_current = (pointer)0x0;
  local_b8.m_it.primitive_iterator.m_it = -0x8000000000000000;
  vVar2 = conf->m_type;
  if (vVar2 == object) {
    local_b8.m_object = conf;
    local_b8.m_it.object_iterator._M_node =
         (_Base_ptr)
         std::
         _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>>
         ::_M_find_tr<char[9],void>
                   ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>,std::_Select1st<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>,std::less<void>,std::allocator<std::pair<std::__cxx11::string_const,nlohmann::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>>>>
                     *)(conf->m_value).object,(char (*) [9])"position");
    vVar2 = conf->m_type;
LAB_0013872b:
    local_f8.m_it.object_iterator._M_node = (_Base_ptr)0x0;
    local_f8.m_it.array_iterator._M_current = (pointer)0x0;
    local_f8.m_it.primitive_iterator.m_it = -0x8000000000000000;
    if (vVar2 != array) {
      if (vVar2 == object) {
        local_f8.m_it.object_iterator._M_node =
             &(((conf->m_value).object)->_M_t)._M_impl.super__Rb_tree_header._M_header;
      }
      else {
        local_f8.m_it.primitive_iterator.m_it = 1;
      }
      goto LAB_00138770;
    }
  }
  else {
    if (vVar2 != array) {
      local_b8.m_it.primitive_iterator.m_it = 1;
      local_b8.m_object = conf;
      goto LAB_0013872b;
    }
    local_b8.m_it.array_iterator._M_current =
         (((conf->m_value).array)->
         super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
         )._M_impl.super__Vector_impl_data._M_finish;
    local_b8.m_object = conf;
  }
  local_f8.m_it.primitive_iterator.m_it = -0x8000000000000000;
  local_f8.m_it.object_iterator._M_node = (_Base_ptr)0x0;
  local_f8.m_it.array_iterator._M_current =
       (((conf->m_value).array)->
       super__Vector_base<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>,_std::allocator<nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>_>
       )._M_impl.super__Vector_impl_data._M_finish;
LAB_00138770:
  local_f8.m_object = conf;
  bVar3 = nlohmann::detail::
          iter_impl<const_nlohmann::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer>_>
          ::operator==(&local_b8,&local_f8);
  if (!bVar3) {
    pvVar4 = nlohmann::
             basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
             ::operator[]<char_const>
                       ((basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::adl_serializer>
                         *)conf,"position");
    vVar12 = json2vec3f(pvVar4);
    __return_storage_ptr__->data[0][3] = vVar12.x;
    __return_storage_ptr__->data[1][3] = vVar12.y;
    __return_storage_ptr__->data[2][3] = vVar12.z;
  }
  return __return_storage_ptr__;
}

Assistant:

mat4f parseTransform(const Json& conf) {
	if (conf.type() == Json::value_t::array) {
		std::vector<float> v = conf;
		if (v.size() != 16)
			throw "bad transformation matrix";
		return mat4f(v[0],v[1],v[2],v[3],v[4],v[5],v[6],v[7],v[8],v[9],v[10],v[11],v[12],v[13],v[14],v[15]);
	}
	mat4f trans = mat4f::unit;
	if (conf.find("scale") != conf.end()) {
		vec3f scale = json2vec3f(conf["scale"]);
		trans[0][0] = scale.x;
		trans[1][1] = scale.y;
		trans[2][2] = scale.z;
	}
	if (conf.find("rotation") != conf.end()) {
		// in degrees
		trans = rotYXZ(json2vec3f(conf["rotation"])) * trans;
	}
	if (conf.find("position") != conf.end()) {
		vec3f offset = json2vec3f(conf["position"]);
		trans[0][3] = offset.x;
		trans[1][3] = offset.y;
		trans[2][3] = offset.z;
	}
	return trans;
}